

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageInputsXrEnumerateEnvironmentBlendModes
                   (XrInstance instance,XrSystemId systemId,
                   XrViewConfigurationType viewConfigurationType,
                   uint32_t environmentBlendModeCapacityInput,
                   uint32_t *environmentBlendModeCountOutput,
                   XrEnvironmentBlendMode *environmentBlendModes)

{
  bool bVar1;
  ValidateXrHandleResult VVar2;
  GenValidUsageXrInstanceInfo *instance_info;
  XrResult XVar3;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  undefined4 in_stack_fffffffffffffd68;
  uint32_t in_stack_fffffffffffffd6c;
  string local_290;
  string local_270;
  XrInstance instance_local;
  string local_248;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_208;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1d8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1c0;
  ostringstream oss;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _oss = 1;
  instance_local = instance;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrInstance_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &objects_info,&instance_local,(XrObjectType *)&oss);
  VVar2 = VerifyXrInstanceHandle(&instance_local);
  if (VVar2 == VALIDATE_XR_HANDLE_SUCCESS) {
    instance_info =
         HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>::get
                   (&g_instance_info.
                     super_HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>,
                    instance_local);
    std::__cxx11::string::string
              ((string *)&oss,"xrEnumerateEnvironmentBlendModes",(allocator *)&local_248);
    std::__cxx11::string::string
              ((string *)&local_290,"xrEnumerateEnvironmentBlendModes",
               (allocator *)&stack0xfffffffffffffd6f);
    std::__cxx11::string::string
              ((string *)&local_270,"viewConfigurationType",(allocator *)&stack0xfffffffffffffd6e);
    bVar1 = ValidateXrEnum(instance_info,(string *)&oss,&local_290,&local_270,&objects_info,
                           viewConfigurationType);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&oss);
    if (bVar1) {
      if (environmentBlendModes == (XrEnvironmentBlendMode *)0x0 &&
          environmentBlendModeCapacityInput != 0) {
        std::__cxx11::string::string
                  ((string *)&oss,
                   "VUID-xrEnumerateEnvironmentBlendModes-environmentBlendModes-parameter",
                   (allocator *)&local_248);
        std::__cxx11::string::string
                  ((string *)&local_290,"xrEnumerateEnvironmentBlendModes",
                   (allocator *)&stack0xfffffffffffffd6f);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_1f0,&objects_info);
        std::__cxx11::string::string
                  ((string *)&local_270,
                   "Command xrEnumerateEnvironmentBlendModes param environmentBlendModes is NULL, but environmentBlendModeCapacityInput is greater than 0"
                   ,(allocator *)&stack0xfffffffffffffd6e);
        CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_290
                            ,(vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              *)&local_1f0,&local_270);
        std::__cxx11::string::~string((string *)&local_270);
        this = &local_1f0;
      }
      else {
        XVar3 = XR_SUCCESS;
        if (environmentBlendModeCountOutput != (uint32_t *)0x0) goto LAB_001bfb31;
        std::__cxx11::string::string
                  ((string *)&oss,
                   "VUID-xrEnumerateEnvironmentBlendModes-environmentBlendModeCountOutput-parameter"
                   ,(allocator *)&local_248);
        std::__cxx11::string::string
                  ((string *)&local_290,"xrEnumerateEnvironmentBlendModes",
                   (allocator *)&stack0xfffffffffffffd6f);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_208,&objects_info);
        std::__cxx11::string::string
                  ((string *)&local_270,
                   "Invalid NULL for uint32_t \"environmentBlendModeCountOutput\" which is not optional and must be non-NULL"
                   ,(allocator *)&stack0xfffffffffffffd6e);
        CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_290
                            ,(vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              *)&local_208,&local_270);
        std::__cxx11::string::~string((string *)&local_270);
        this = &local_208;
      }
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(this);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&oss);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      std::operator<<((ostream *)&oss,
                      "Invalid XrViewConfigurationType \"viewConfigurationType\" enum value ");
      Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffd6c);
      std::operator<<((ostream *)&oss,(string *)&local_290);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::string
                ((string *)&local_290,
                 "VUID-xrEnumerateEnvironmentBlendModes-viewConfigurationType-parameter",
                 (allocator *)&stack0xfffffffffffffd6f);
      std::__cxx11::string::string
                ((string *)&local_270,"xrEnumerateEnvironmentBlendModes",
                 (allocator *)&stack0xfffffffffffffd6e);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1d8,&objects_info);
      std::__cxx11::stringbuf::str();
      CoreValidLogMessage(instance_info,&local_290,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_270,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1d8,&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_1d8);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    }
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"Invalid XrInstance handle \"instance\" ");
    HandleToHexString<XrInstance_T*>
              ((XrInstance_T *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    std::operator<<((ostream *)&oss,(string *)&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::string
              ((string *)&local_290,"VUID-xrEnumerateEnvironmentBlendModes-instance-parameter",
               (allocator *)&stack0xfffffffffffffd6f);
    std::__cxx11::string::string
              ((string *)&local_270,"xrEnumerateEnvironmentBlendModes",
               (allocator *)&stack0xfffffffffffffd6e);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1c0,&objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_290,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_270,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1c0,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1c0);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    XVar3 = XR_ERROR_HANDLE_INVALID;
  }
LAB_001bfb31:
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(&objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               );
  return XVar3;
}

Assistant:

XrResult GenValidUsageInputsXrEnumerateEnvironmentBlendModes(
XrInstance instance,
XrSystemId systemId,
XrViewConfigurationType viewConfigurationType,
uint32_t environmentBlendModeCapacityInput,
uint32_t* environmentBlendModeCountOutput,
XrEnvironmentBlendMode* environmentBlendModes) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(instance, XR_OBJECT_TYPE_INSTANCE);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrInstanceHandle(&instance);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrInstance handle \"instance\" ";
                oss << HandleToHexString(instance);
                CoreValidLogMessage(nullptr, "VUID-xrEnumerateEnvironmentBlendModes-instance-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentBlendModes",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        GenValidUsageXrInstanceInfo *gen_instance_info = g_instance_info.get(instance);
        (void)gen_instance_info;  // quiet warnings
        // Make sure the enum type XrViewConfigurationType value is valid
        if (!ValidateXrEnum(gen_instance_info, "xrEnumerateEnvironmentBlendModes", "xrEnumerateEnvironmentBlendModes", "viewConfigurationType", objects_info, viewConfigurationType)) {
            std::ostringstream oss_enum;
            oss_enum << "Invalid XrViewConfigurationType \"viewConfigurationType\" enum value ";
            oss_enum << Uint32ToHexString(static_cast<uint32_t>(viewConfigurationType));
            CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateEnvironmentBlendModes-viewConfigurationType-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentBlendModes",
                                objects_info, oss_enum.str());
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Optional array must be non-NULL when environmentBlendModeCapacityInput is non-zero
        if (0 != environmentBlendModeCapacityInput && nullptr == environmentBlendModes) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateEnvironmentBlendModes-environmentBlendModes-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentBlendModes",
                                objects_info,
                                "Command xrEnumerateEnvironmentBlendModes param environmentBlendModes is NULL, but environmentBlendModeCapacityInput is greater than 0");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == environmentBlendModeCountOutput) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateEnvironmentBlendModes-environmentBlendModeCountOutput-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentBlendModes", objects_info,
                                "Invalid NULL for uint32_t \"environmentBlendModeCountOutput\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // NOTE: Can't validate "VUID-xrEnumerateEnvironmentBlendModes-environmentBlendModeCountOutput-parameter" type
                // NOTE: Can't validate "VUID-xrEnumerateEnvironmentBlendModes-environmentBlendModes-parameter" output enum buffer
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}